

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strequal.c
# Opt level: O2

int curl_strnequal(char *first,char *second,size_t max)

{
  char cVar1;
  uint uVar2;
  __int32_t **pp_Var3;
  size_t sVar4;
  long lVar5;
  
  for (sVar4 = 0;
      ((lVar5 = (long)first[sVar4], lVar5 != 0 && (cVar1 = second[sVar4], (long)cVar1 != 0)) &&
      (max != sVar4)); sVar4 = sVar4 + 1) {
    pp_Var3 = __ctype_toupper_loc();
    if ((*pp_Var3)[lVar5] != (*pp_Var3)[cVar1]) goto LAB_0011f2a2;
  }
  if (max == sVar4) {
    uVar2 = 1;
  }
  else {
    pp_Var3 = __ctype_toupper_loc();
LAB_0011f2a2:
    uVar2 = (uint)((*pp_Var3)[lVar5] == (*pp_Var3)[second[sVar4]]);
  }
  return uVar2;
}

Assistant:

int curl_strnequal(const char *first, const char *second, size_t max)
{
#if defined(HAVE_STRNCASECMP)
  return !strncasecmp(first, second, max);
#elif defined(HAVE_STRNCMPI)
  return !strncmpi(first, second, max);
#elif defined(HAVE_STRNICMP)
  return !strnicmp(first, second, max);
#else
  while(*first && *second && max) {
    if(toupper(*first) != toupper(*second)) {
      break;
    }
    max--;
    first++;
    second++;
  }
  if(0 == max)
    return 1; /* they are equal this far */

  return toupper(*first) == toupper(*second);
#endif
}